

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O3

void scalar_centered_binomial_distribution_eta_2_with_prf(scalar *out,uint8_t *input)

{
  undefined4 uVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [15];
  ulong uVar8;
  undefined1 auVar9 [15];
  undefined1 auVar10 [13];
  unkuint9 Var11;
  undefined1 auVar12 [11];
  undefined1 auVar13 [14];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  uint6 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  long lVar19;
  ushort uVar21;
  undefined1 auVar20 [15];
  undefined1 auVar22 [16];
  int iVar23;
  int iVar24;
  byte bVar28;
  int iVar29;
  int iVar31;
  undefined1 auVar25 [16];
  int iVar33;
  undefined1 auVar26 [16];
  int iVar30;
  int iVar32;
  int iVar34;
  undefined1 auVar27 [16];
  uint uVar37;
  uint uVar38;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  uint8_t entropy [128];
  uint8_t local_88 [128];
  
  BORINGSSL_keccak(local_88,0x80,input,0x21,boringssl_shake256);
  auVar18 = _DAT_0023a1a0;
  auVar17 = _DAT_002323b0;
  lVar19 = 0;
  do {
    uVar1 = *(undefined4 *)(local_88 + lVar19);
    bVar28 = (byte)((uint)uVar1 >> 0x18);
    uVar8 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
    auVar4._8_4_ = 0;
    auVar4._0_8_ = uVar8;
    auVar4[0xc] = bVar28;
    auVar5[8] = (char)((uint)uVar1 >> 0x10);
    auVar5._0_8_ = uVar8;
    auVar5[9] = 0;
    auVar5._10_3_ = auVar4._10_3_;
    auVar10._5_8_ = 0;
    auVar10._0_5_ = auVar5._8_5_;
    auVar25._0_4_ = (uint)uVar8;
    auVar6[4] = (char)((uint)uVar1 >> 8);
    auVar6._0_4_ = auVar25._0_4_;
    auVar6[5] = 0;
    auVar6._6_7_ = SUB137(auVar10 << 0x40,6);
    auVar25._4_9_ = auVar6._4_9_;
    auVar25._13_3_ = 0;
    auVar22 = auVar25 & auVar18;
    auVar35._0_4_ = auVar25._0_4_ >> 1;
    uVar37 = auVar6._4_4_;
    auVar35._4_4_ = uVar37 >> 1;
    uVar38 = auVar5._8_4_;
    auVar35._8_4_ = uVar38 >> 1;
    auVar35[0xc] = bVar28 >> 1;
    auVar35._13_3_ = 0;
    auVar35 = auVar35 & auVar18;
    iVar23 = ((int)(auVar25._0_4_ << 0x1c) >> 0x1f) + auVar22._0_4_ +
             ((int)(auVar25._0_4_ << 0x1d) >> 0x1f) + auVar35._0_4_;
    iVar29 = ((int)(uVar37 << 0x1c) >> 0x1f) + auVar22._4_4_ +
             ((int)(uVar37 << 0x1d) >> 0x1f) + auVar35._4_4_;
    iVar31 = ((int)(uVar38 << 0x1c) >> 0x1f) + auVar22._8_4_ +
             ((int)(uVar38 << 0x1d) >> 0x1f) + auVar35._8_4_;
    iVar33 = ((int)((uint)bVar28 << 0x1c) >> 0x1f) + auVar22._12_4_ +
             ((int)((uint)bVar28 << 0x1d) >> 0x1f) + auVar35._12_4_;
    auVar20 = ZEXT415(CONCAT22((ushort)((uint)uVar1 >> 0x14),(ushort)uVar1 >> 4)) & auVar17._0_15_;
    Var11 = CONCAT81(SUB158(ZEXT115(0) << 0x40,7),auVar20[3]);
    auVar14._9_6_ = 0;
    auVar14._0_9_ = Var11;
    auVar12._1_10_ = SUB1510(auVar14 << 0x30,5);
    auVar12[0] = auVar20[2];
    auVar15._11_4_ = 0;
    auVar15._0_11_ = auVar12;
    auVar7[2] = auVar20[1];
    auVar7._0_2_ = auVar20._0_2_;
    auVar7._3_12_ = SUB1512(auVar15 << 0x20,3);
    auVar9._2_13_ = auVar7._2_13_;
    auVar9._0_2_ = auVar20._0_2_ & 0xff;
    uVar21 = (ushort)Var11;
    auVar2._10_2_ = 0;
    auVar2._0_10_ = auVar9._0_10_;
    auVar2._12_2_ = uVar21;
    uVar16 = CONCAT42(auVar2._10_4_,auVar12._0_2_);
    auVar13._6_8_ = 0;
    auVar13._0_6_ = uVar16;
    auVar3._4_2_ = auVar7._2_2_;
    auVar3._0_4_ = auVar9._0_4_;
    auVar3._6_8_ = SUB148(auVar13 << 0x40,6);
    auVar22._0_4_ = auVar9._0_4_ & 0xffff;
    auVar22._4_10_ = auVar3._4_10_;
    auVar22._14_2_ = 0;
    auVar26 = auVar22 & auVar18;
    auVar36._0_4_ = auVar22._0_4_ >> 1;
    uVar37 = auVar3._4_4_;
    auVar36._4_4_ = uVar37 >> 1;
    uVar38 = (uint)uVar16;
    auVar36._8_4_ = uVar38 >> 1;
    auVar36._12_2_ = uVar21 >> 1;
    auVar36._14_2_ = 0;
    auVar36 = auVar36 & auVar18;
    iVar24 = (auVar26._0_4_ - (auVar22._0_4_ >> 3)) + auVar36._0_4_ +
             ((int)(auVar22._0_4_ << 0x1d) >> 0x1f);
    iVar30 = (auVar26._4_4_ - (uVar37 >> 3)) + auVar36._4_4_ + ((int)(uVar37 << 0x1d) >> 0x1f);
    iVar32 = (auVar26._8_4_ - (uVar38 >> 3)) + auVar36._8_4_ + ((int)(uVar38 << 0x1d) >> 0x1f);
    iVar34 = (auVar26._12_4_ - (uint)(uVar21 >> 3)) + auVar36._12_4_ +
             ((int)((uint)uVar21 << 0x1d) >> 0x1f);
    auVar26._0_4_ = (int)(((iVar31 >> 0x1f & 0xd01U) + iVar31) * 0x10000) >> 0x10;
    auVar26._4_4_ = (int)(((iVar32 >> 0x1f & 0xd01U) + iVar32) * 0x10000) >> 0x10;
    auVar26._8_4_ = (int)(((iVar33 >> 0x1f & 0xd01U) + iVar33) * 0x10000) >> 0x10;
    auVar26._12_4_ = (int)(((iVar34 >> 0x1f & 0xd01U) + iVar34) * 0x10000) >> 0x10;
    auVar27._0_4_ = (int)(((iVar23 >> 0x1f & 0xd01U) + iVar23) * 0x10000) >> 0x10;
    auVar27._4_4_ = (int)(((iVar24 >> 0x1f & 0xd01U) + iVar24) * 0x10000) >> 0x10;
    auVar27._8_4_ = (int)(short)(((ushort)(iVar29 >> 0x1f) & 0xd01) + (short)iVar29);
    auVar27._12_4_ = (int)(short)(((ushort)(iVar30 >> 0x1f) & 0xd01) + (short)iVar30);
    auVar22 = packssdw(auVar27,auVar26);
    *(undefined1 (*) [16])(out->c + lVar19 * 2) = auVar22;
    lVar19 = lVar19 + 4;
  } while (lVar19 != 0x80);
  return;
}

Assistant:

static void scalar_centered_binomial_distribution_eta_2_with_prf(
    scalar *out, const uint8_t input[33]) {
  uint8_t entropy[128];
  static_assert(sizeof(entropy) == 2 * /*kEta=*/2 * DEGREE / 8, "");
  prf(entropy, sizeof(entropy), input);

  for (int i = 0; i < DEGREE; i += 2) {
    uint8_t byte = entropy[i / 2];

    uint16_t value = (byte & 1) + ((byte >> 1) & 1);
    value -= ((byte >> 2) & 1) + ((byte >> 3) & 1);
    // Add |kPrime| if |value| underflowed. See |reduce_once| for a discussion
    // on why the value barrier is omitted. While this could have been written
    // reduce_once(value + kPrime), this is one extra addition and small range
    // of |value| tempts some versions of Clang to emit a branch.
    uint16_t mask = 0u - (value >> 15);
    out->c[i] = value + (kPrime & mask);

    byte >>= 4;
    value = (byte & 1) + ((byte >> 1) & 1);
    value -= ((byte >> 2) & 1) + ((byte >> 3) & 1);
    // See above.
    mask = 0u - (value >> 15);
    out->c[i + 1] = value + (kPrime & mask);
  }
}